

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzip.c++
# Opt level: O0

void __thiscall kj::GzipOutputStream::pump(GzipOutputStream *this,int flush)

{
  TypeByIndex<0UL,_bool,_kj::ArrayPtr<const_unsigned_char>_> TVar1;
  OutputStream *pOVar2;
  TypeByIndex<0UL,_bool,_kj::ArrayPtr<const_unsigned_char>_> *pTVar3;
  TypeByIndex<1UL,_bool,_kj::ArrayPtr<const_unsigned_char>_> *pTVar4;
  uchar *puVar5;
  size_t sVar6;
  undefined1 local_40 [8];
  TypeByIndex<1UL,_bool,_kj::ArrayPtr<const_unsigned_char>_> chunk;
  Tuple<bool,_kj::ArrayPtr<const_byte>_> result;
  bool ok;
  int flush_local;
  GzipOutputStream *this_local;
  
  do {
    _::GzipOutputContext::pumpOnce
              ((Tuple<bool,_kj::ArrayPtr<const_byte>_> *)&chunk.size_,&this->ctx,flush);
    pTVar3 = get<0ul,kj::_::Tuple<bool,kj::ArrayPtr<unsigned_char_const>>&>
                       ((Tuple<bool,_kj::ArrayPtr<const_unsigned_char>_> *)&chunk.size_);
    TVar1 = *pTVar3;
    pTVar4 = get<1ul,kj::_::Tuple<bool,kj::ArrayPtr<unsigned_char_const>>&>
                       ((Tuple<bool,_kj::ArrayPtr<const_unsigned_char>_> *)&chunk.size_);
    local_40 = (undefined1  [8])pTVar4->ptr;
    chunk.ptr = (uchar *)pTVar4->size_;
    pOVar2 = this->inner;
    puVar5 = ArrayPtr<const_unsigned_char>::begin((ArrayPtr<const_unsigned_char> *)local_40);
    sVar6 = ArrayPtr<const_unsigned_char>::size((ArrayPtr<const_unsigned_char> *)local_40);
    (*pOVar2->_vptr_OutputStream[2])(pOVar2,puVar5,sVar6);
  } while ((TVar1 & 1U) != 0);
  return;
}

Assistant:

void GzipOutputStream::pump(int flush) {
  bool ok;
  do {
    auto result = ctx.pumpOnce(flush);
    ok = get<0>(result);
    auto chunk = get<1>(result);
    inner.write(chunk.begin(), chunk.size());
  } while (ok);
}